

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O2

void libtorrent::aux::move_file(string *inf,string *newf,storage_error *se)

{
  operation_t oVar1;
  bool bVar2;
  file_status s;
  string sStack_78;
  file_status local_58;
  
  (se->ec).val_ = 0;
  (se->ec).failed_ = false;
  (se->ec).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_58.mtime = 0;
  local_58.ctime = 0;
  local_58.file_size = 0;
  local_58.atime = 0;
  local_58.mode.m_val = 0;
  stat_file(inf,&local_58,&se->ec,(file_status_flag_t)0x0);
  oVar1 = file_stat;
  if ((se->ec).val_ == 0) {
    bVar2 = has_parent_path(newf);
    if (bVar2) {
      parent_path(&sStack_78,newf);
      create_directories(&sStack_78,&se->ec);
      ::std::__cxx11::string::~string((string *)&sStack_78);
      oVar1 = mkdir;
      if ((se->ec).val_ != 0) goto LAB_002cb1ad;
    }
    rename((libtorrent *)inf,(char *)newf,(char *)se);
    oVar1 = file_rename;
    if ((se->ec).val_ == 0) {
      return;
    }
  }
LAB_002cb1ad:
  se->operation = oVar1;
  return;
}

Assistant:

void move_file(std::string const& inf, std::string const& newf, storage_error& se)
	{
		se.ec.clear();

		file_status s;
		stat_file(inf, &s, se.ec);
		if (se)
		{
			se.operation = operation_t::file_stat;
			return;
		}

		if (has_parent_path(newf))
		{
			create_directories(parent_path(newf), se.ec);
			if (se)
			{
				se.operation = operation_t::mkdir;
				return;
			}
		}

		rename(inf, newf, se.ec);
		if (se)
			se.operation = operation_t::file_rename;
	}